

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::append_attribute(xml_attribute_struct *attr,xml_node_struct *node)

{
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *tail;
  xml_attribute_struct *head;
  xml_node_struct *node_local;
  xml_attribute_struct *attr_local;
  
  pxVar1 = node->first_attribute;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    node->first_attribute = attr;
    attr->prev_attribute_c = attr;
  }
  else {
    pxVar2 = pxVar1->prev_attribute_c;
    pxVar2->next_attribute = attr;
    attr->prev_attribute_c = pxVar2;
    pxVar1->prev_attribute_c = attr;
  }
  return;
}

Assistant:

inline void append_attribute(xml_attribute_struct* attr, xml_node_struct* node)
	{
		xml_attribute_struct* head = node->first_attribute;

		if (head)
		{
			xml_attribute_struct* tail = head->prev_attribute_c;

			tail->next_attribute = attr;
			attr->prev_attribute_c = tail;
			head->prev_attribute_c = attr;
		}
		else
		{
			node->first_attribute = attr;
			attr->prev_attribute_c = attr;
		}
	}